

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O0

void av1_filter_block_plane_vert_opt_chroma
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,int plane,
               _Bool joint_filter_chroma,int num_mis_in_lpf_unit_height_log2)

{
  uint uVar1;
  BLOCK_SIZE *pBVar2;
  BLOCK_SIZE BVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 *in_R9;
  BLOCK_SIZE *in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  uint32_t advance_units_1;
  uint8_t *dst_ptr;
  uint8_t *v_dst;
  uint8_t *u_dst;
  int offset;
  int x;
  int y_inc;
  int use_filter_type;
  TX_SIZE *tx_size;
  AV1_DEBLOCKING_PARAMETERS *params;
  int min_height;
  uint32_t x_end;
  uint32_t x_start;
  uint32_t curr_y;
  int y;
  ptrdiff_t mode_step;
  int x_range;
  int y_range;
  int plane_mi_cols;
  int plane_mi_rows;
  int mi_rows;
  int mi_cols;
  int dst_stride;
  uint32_t scale_vert;
  uint32_t scale_horz;
  int advance_units;
  TX_SIZE prev_tx_size;
  uint32_t scale;
  uint32_t *counter_ptr;
  TX_SIZE *tx_size_1;
  AV1_DEBLOCKING_PARAMETERS *params_1;
  int is_vert;
  int tx_dim_1;
  loop_filter_thresh *limits_1;
  int32_t pu_edge_1;
  uint8_t level_1;
  TX_SIZE pv_ts_1;
  int pv_col_1;
  int pv_row_1;
  MB_MODE_INFO *mi_prev_1;
  _Bool curr_skipped_1;
  TX_SIZE ts_1;
  MB_MODE_INFO *mbmi_1;
  MB_MODE_INFO **mi_1;
  int is_vert_2;
  TX_SIZE mb_tx_size_3;
  int blk_col_3;
  int blk_row_3;
  BLOCK_SIZE sb_type_3;
  TX_SIZE tx_size_5;
  TX_SIZE mb_tx_size_2;
  int blk_col_2;
  int blk_row_2;
  BLOCK_SIZE sb_type_2;
  TX_SIZE tx_size_4;
  int tx_dim;
  loop_filter_thresh *limits;
  int32_t pu_edge;
  uint8_t level;
  TX_SIZE pv_ts;
  int pv_col;
  int pv_row;
  MB_MODE_INFO *mi_prev;
  _Bool curr_skipped;
  TX_SIZE ts;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO **mi;
  int is_vert_1;
  TX_SIZE mb_tx_size_1;
  int blk_col_1;
  int blk_row_1;
  BLOCK_SIZE sb_type_1;
  TX_SIZE tx_size_3;
  TX_SIZE mb_tx_size;
  int blk_col;
  int blk_row;
  BLOCK_SIZE sb_type;
  TX_SIZE tx_size_2;
  int in_stack_fffffffffffffb9c;
  int in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  int local_458;
  int local_454;
  uint32_t in_stack_fffffffffffffbb0;
  uint in_stack_fffffffffffffbb4;
  int in_stack_fffffffffffffbb8;
  uint in_stack_fffffffffffffbbc;
  loop_filter_info_n *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  uint in_stack_fffffffffffffbcc;
  uint local_430;
  uint local_42c;
  int local_40c;
  int local_408;
  uint32_t in_stack_fffffffffffffc00;
  uint in_stack_fffffffffffffc04;
  int in_stack_fffffffffffffc08;
  uint in_stack_fffffffffffffc0c;
  AV1_DEBLOCKING_PARAMETERS *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  uint in_stack_fffffffffffffc1c;
  uint in_stack_fffffffffffffc20;
  uint in_stack_fffffffffffffc24;
  BLOCK_SIZE *in_stack_fffffffffffffc28;
  int local_3ac;
  int local_3a8;
  int local_384;
  int local_380;
  BLOCK_SIZE *local_378;
  undefined1 *local_370;
  int local_364;
  uint local_360;
  uint local_35c;
  uint local_358;
  uint local_354;
  long local_350;
  int local_348;
  int local_344;
  int local_340;
  int local_33c;
  int local_338;
  int local_334;
  undefined4 local_330;
  uint local_32c;
  uint local_328;
  byte local_321;
  undefined1 *local_320;
  uint local_318;
  uint local_314;
  long local_310;
  long local_308;
  long local_300;
  int local_2f4;
  BLOCK_SIZE local_2ed;
  uint local_2ec;
  uint *local_2e8;
  BLOCK_SIZE *local_2e0;
  undefined1 *local_2d8;
  int local_2cc;
  uint local_2c8;
  int local_2c4;
  int *local_2c0;
  uint local_2b8;
  uint local_2b4;
  long local_2b0;
  uint local_2a4;
  long local_2a0;
  uint local_294;
  uint local_290;
  char local_289;
  long local_288;
  long local_280;
  undefined1 *local_270;
  int local_264;
  long local_260;
  uint local_258;
  byte local_252;
  BLOCK_SIZE local_251;
  uint local_250;
  uint local_24c;
  loop_filter_info_n *local_248;
  byte local_23a;
  BLOCK_SIZE local_239;
  loop_filter_info_n *local_238;
  undefined8 *local_230;
  uint local_224;
  uint local_220;
  int local_21c;
  int *local_218;
  uint local_210;
  uint local_20c;
  long local_208;
  long local_200;
  BLOCK_SIZE local_1f2;
  byte local_1f1;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  char local_1e1;
  long local_1e0;
  long local_1d8;
  BLOCK_SIZE *local_1d0;
  undefined1 *local_1c8;
  BLOCK_SIZE local_1b9;
  uint local_1b8;
  uint local_1b4;
  BLOCK_SIZE local_1ae;
  BLOCK_SIZE local_1ad;
  uint local_1ac;
  uint local_1a8;
  int local_1a4;
  uint local_1a0;
  uint local_19c;
  loop_filter_info_n *local_198;
  long local_190;
  BLOCK_SIZE local_182;
  BLOCK_SIZE local_181;
  uint local_180;
  uint local_17c;
  BLOCK_SIZE local_176;
  BLOCK_SIZE local_175;
  uint local_174;
  uint local_170;
  int local_16c;
  uint local_168;
  uint local_164;
  BLOCK_SIZE *local_160;
  long local_158;
  BLOCK_SIZE local_14d;
  int local_14c;
  long local_148;
  uint local_140;
  byte local_13a;
  byte local_139;
  uint local_138;
  uint local_134;
  AV1_DEBLOCKING_PARAMETERS *local_130;
  byte local_122;
  BLOCK_SIZE local_121;
  AV1_DEBLOCKING_PARAMETERS *local_120;
  undefined8 *local_118;
  int local_10c;
  uint local_108;
  int local_104;
  int *local_100;
  uint local_f8;
  uint local_f4;
  long local_f0;
  long local_e8;
  byte local_da;
  byte local_d9;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  undefined1 local_c9;
  long local_c8;
  long local_c0;
  BLOCK_SIZE *local_b8;
  undefined1 *local_b0;
  byte local_a1;
  uint local_a0;
  uint local_9c;
  BLOCK_SIZE local_96;
  byte local_95;
  uint local_94;
  uint local_90;
  int local_8c;
  uint local_88;
  uint local_84;
  AV1_DEBLOCKING_PARAMETERS *local_80;
  long local_78;
  byte local_6a;
  BLOCK_SIZE local_69;
  uint local_68;
  uint local_64;
  BLOCK_SIZE local_5e;
  BLOCK_SIZE local_5d;
  uint local_5c;
  uint local_58;
  int local_54;
  uint local_50;
  uint local_4c;
  BLOCK_SIZE *local_48;
  long local_40;
  BLOCK_SIZE local_31;
  
  local_321 = in_stack_00000018 & 1;
  local_328 = *(uint *)(in_RDX + 4);
  local_32c = *(uint *)(in_RDX + 8);
  local_330 = *(undefined4 *)(in_RDX + 0x28);
  bVar6 = (byte)local_328;
  local_334 = (*(int *)(in_RDX + 0x20) << (bVar6 & 0x1f)) + 3 >> 2;
  bVar7 = (byte)local_32c;
  local_338 = (*(int *)(in_RDX + 0x24) << (bVar7 & 0x1f)) + 3 >> 2;
  local_33c = local_338 + ((1 << (bVar7 & 0x1f)) >> 1) >> (bVar7 & 0x1f);
  local_340 = local_334 + ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f);
  if ((int)(local_33c - (in_ECX >> (bVar7 & 0x1f))) <
      (1 << (in_stack_00000020 & 0x1f)) >> (bVar7 & 0x1f)) {
    local_3a8 = local_33c - (in_ECX >> (bVar7 & 0x1f));
  }
  else {
    local_3a8 = (1 << (in_stack_00000020 & 0x1f)) >> (bVar7 & 0x1f);
  }
  local_344 = local_3a8;
  if ((int)(local_340 - (in_R8D >> (bVar6 & 0x1f))) < 0x20 >> (bVar6 & 0x1f)) {
    local_3ac = local_340 - (in_R8D >> (bVar6 & 0x1f));
  }
  else {
    local_3ac = 0x20 >> (bVar6 & 0x1f);
  }
  local_348 = local_3ac;
  local_350 = 1L << (bVar6 & 0x3f);
  local_320 = in_R9;
  local_318 = in_R8D;
  local_314 = in_ECX;
  local_310 = in_RDX;
  local_308 = in_RSI;
  local_300 = in_RDI;
  for (local_354 = 0; (int)local_354 < local_344; local_354 = local_380 + local_354 + 1) {
    bVar6 = (byte)local_32c & 0x1f;
    local_358 = local_314 + (local_354 << bVar6);
    local_35c = local_318 + ((0 << bVar6) << ((byte)local_328 & 0x1f));
    local_360 = local_318 + (local_348 << ((byte)local_328 & 0x1f));
    local_364 = 0x40;
    local_270 = local_320;
    local_280 = local_300;
    local_288 = local_308;
    local_289 = '\0';
    local_2a0 = local_310;
    local_2b0 = local_350;
    local_2b4 = local_328;
    local_2b8 = local_32c;
    local_2c0 = &local_364;
    local_2c4 = in_stack_00000010;
    local_2c8 = (uint)(local_321 & 1);
    local_2cc = 1;
    local_2d8 = local_320;
    local_2e0 = in_stack_00000008;
    local_2e8 = &local_290;
    local_2ec = local_328;
    local_2ed = 0xff;
    local_d8 = local_290;
    local_b0 = local_320;
    local_b8 = in_stack_00000008;
    local_c0 = local_300;
    local_c8 = local_308;
    local_c9 = 0;
    local_d9 = 1;
    local_da = 0xff;
    local_e8 = local_310;
    local_f0 = local_350;
    local_f4 = local_328;
    local_f8 = local_32c;
    local_104 = in_stack_00000010;
    local_10c = 1;
    *local_320 = 0;
    local_d4 = local_32c | local_358;
    local_d0 = local_328 | local_35c;
    local_118 = (undefined8 *)
                (*(long *)(local_300 + 0x238) + (ulong)(local_d4 * *(int *)(local_300 + 0x244)) * 8
                + (ulong)local_d0 * 8);
    local_120 = (AV1_DEBLOCKING_PARAMETERS *)*local_118;
    local_48 = (BLOCK_SIZE *)*local_118;
    local_40 = local_308;
    local_54 = in_stack_00000010;
    local_58 = local_328;
    local_5c = local_32c;
    local_2a4 = local_360;
    local_294 = local_358;
    local_290 = local_35c;
    local_108 = local_2c8;
    local_100 = local_2c0;
    local_50 = local_d0;
    local_4c = local_d4;
    if ((local_308 == 0) ||
       (*(int *)(local_308 + 0x29c4 + (ulong)((byte)*(undefined2 *)(local_48 + 0xa7) & 7) * 4) == 0)
       ) {
      if (in_stack_00000010 == 0) {
        local_5d = local_48[0x91];
      }
      else {
        local_5d = av1_get_max_uv_txsize
                             ((BLOCK_SIZE)((uint)in_stack_fffffffffffffba4 >> 0x18),
                              in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
      }
      if (((local_54 == 0) &&
          (iVar4 = is_inter_block((MB_MODE_INFO *)
                                  CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)),
          iVar4 != 0)) && (local_48[0x90] == BLOCK_4X4)) {
        local_5e = *local_48;
        local_64 = local_4c &
                   "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [local_5e] - 1;
        local_68 = local_50 &
                   "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [local_5e] - 1;
        in_stack_fffffffffffffc28 = local_48;
        iVar4 = av1_get_txb_size_index(local_5e,local_64,local_68);
        local_69 = in_stack_fffffffffffffc28[(long)iVar4 + 0x92];
        local_5d = local_69;
      }
      local_31 = local_5d;
    }
    else {
      local_31 = BLOCK_4X4;
    }
    local_121 = local_31;
    *local_b8 = local_31;
    local_122 = 0;
    if (((local_d9 & 1) == 0) || (local_d8 != 0)) {
      local_130 = (AV1_DEBLOCKING_PARAMETERS *)local_118[-local_f0];
      if (local_10c == 0) {
        in_stack_fffffffffffffc24 = local_d4 - (1 << ((byte)local_f8 & 0x1f));
        in_stack_fffffffffffffc20 = local_d0;
      }
      else {
        in_stack_fffffffffffffc20 = local_d0 - (1 << ((byte)local_f4 & 0x1f));
        in_stack_fffffffffffffc24 = local_d4;
      }
      local_138 = in_stack_fffffffffffffc20;
      local_134 = in_stack_fffffffffffffc24;
      bVar6 = local_da;
      if ((local_d9 & 1) != 0) {
        local_78 = local_c8;
        local_8c = local_104;
        local_90 = local_f4;
        local_94 = local_f8;
        local_88 = in_stack_fffffffffffffc20;
        local_84 = in_stack_fffffffffffffc24;
        local_80 = local_130;
        if ((local_c8 == 0) ||
           (*(int *)(local_c8 + 0x29c4 +
                    (ulong)((byte)*(undefined2 *)&local_130[10].field_0x7 & 7) * 4) == 0)) {
          if (local_104 == 0) {
            local_95 = local_130[9].field_0x1;
          }
          else {
            local_95 = av1_get_max_uv_txsize
                                 ((BLOCK_SIZE)((uint)in_stack_fffffffffffffba4 >> 0x18),
                                  in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
          }
          in_stack_fffffffffffffc1c = (uint)local_95;
          if (((local_8c == 0) &&
              (iVar4 = is_inter_block((MB_MODE_INFO *)
                                      CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0))
              , iVar4 != 0)) && (local_80[9].filter_length == '\0')) {
            local_96 = local_80->filter_length;
            local_9c = local_84 &
                       "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [local_96] - 1;
            local_a0 = local_88 &
                       "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [local_96] - 1;
            in_stack_fffffffffffffc10 = local_80;
            iVar4 = av1_get_txb_size_index(local_96,local_9c,local_a0);
            local_a1 = (&in_stack_fffffffffffffc10[9].field_0x2)[iVar4];
            local_95 = local_a1;
          }
          local_6a = local_95;
          bVar6 = local_95;
        }
        else {
          local_6a = 0;
          bVar6 = local_6a;
        }
      }
      local_139 = bVar6;
      in_stack_fffffffffffffc0c = (uint)local_139;
      if ((local_d9 & 1) != 0) {
        if (local_10c == 0) {
          in_stack_fffffffffffffc08 = tx_size_wide[local_139];
        }
        else {
          in_stack_fffffffffffffc08 = tx_size_high[local_139];
        }
        *local_100 = in_stack_fffffffffffffc08;
      }
      local_13a = get_filter_level((AV1_COMMON *)
                                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                   in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                   in_stack_fffffffffffffbb8,
                                   (MB_MODE_INFO *)
                                   CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      if (local_13a == 0) {
        local_13a = get_filter_level((AV1_COMMON *)
                                     CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                     in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                     in_stack_fffffffffffffbb8,
                                     (MB_MODE_INFO *)
                                     CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      }
      local_140 = (uint)(local_130 != local_120);
      if (local_140 == 0) {
        in_stack_fffffffffffffc04 = in_stack_fffffffffffffc04 & 0xffffff;
        if (local_120[9].filter_length != '\0') {
          iVar4 = is_inter_block((MB_MODE_INFO *)
                                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
          in_stack_fffffffffffffc04 = CONCAT13(iVar4 != 0,(int3)in_stack_fffffffffffffc04);
        }
        local_122 = (byte)(in_stack_fffffffffffffc04 >> 0x18);
      }
      if ((((local_122 & 1) == 0) || (local_140 != 0)) && (local_13a != 0)) {
        if (local_10c == 0) {
          in_stack_fffffffffffffc00 = horz_filter_length_chroma[local_121][local_139];
        }
        else {
          in_stack_fffffffffffffc00 = vert_filter_length_chroma[local_121][local_139];
        }
        *local_b0 = (char)in_stack_fffffffffffffc00;
        local_148 = local_c0 + 0x4af0;
        *(long *)(local_b0 + 8) = local_148 + (long)(int)(uint)local_13a * 0x30;
      }
    }
    if (local_10c == 0) {
      iVar4 = tx_size_wide[local_121];
    }
    else {
      iVar4 = tx_size_high[local_121];
    }
    local_408 = iVar4;
    if (*local_100 < iVar4) {
      local_408 = *local_100;
    }
    local_14c = iVar4;
    *local_100 = local_408;
    if (local_2cc == 0) {
      local_40c = tx_size_high_unit[*local_2e0];
    }
    else {
      local_40c = tx_size_wide_unit[*local_2e0];
    }
    local_2f4 = local_40c;
    local_2ed = *local_2e0;
    *local_2e8 = (local_40c << ((byte)local_2ec & 0x1f)) + *local_2e8;
    local_2d8 = local_2d8 + (long)local_40c * 0x10;
    local_2e0 = local_2e0 + local_40c;
    while (*local_2e8 < local_2a4) {
      local_1f0 = *local_2e8;
      local_1c8 = local_2d8;
      local_1d0 = local_2e0;
      local_1d8 = local_280;
      local_1e0 = local_288;
      local_1e1 = local_289;
      local_1f1 = 0;
      local_1f2 = local_2ed;
      local_200 = local_2a0;
      local_208 = local_2b0;
      local_20c = local_2b4;
      local_210 = local_2b8;
      local_218 = local_2c0;
      local_21c = local_2c4;
      local_220 = local_2c8;
      local_224 = (uint)(local_289 == '\0');
      *local_2d8 = 0;
      local_1ec = local_2b8 | local_294;
      local_1e8 = local_2b4 | local_290;
      local_230 = (undefined8 *)
                  (*(long *)(local_280 + 0x238) +
                   (ulong)(local_1ec * *(int *)(local_280 + 0x244)) * 8 + (ulong)local_1e8 * 8);
      local_238 = (loop_filter_info_n *)*local_230;
      local_160 = (BLOCK_SIZE *)*local_230;
      local_158 = local_288;
      local_16c = local_2c4;
      local_170 = local_2b4;
      local_174 = local_2b8;
      local_168 = local_1e8;
      local_164 = local_1ec;
      if ((local_288 == 0) ||
         (*(int *)(local_288 + 0x29c4 + (ulong)((byte)*(undefined2 *)(local_160 + 0xa7) & 7) * 4) ==
          0)) {
        if (local_2c4 == 0) {
          local_175 = local_160[0x91];
        }
        else {
          local_175 = av1_get_max_uv_txsize
                                ((BLOCK_SIZE)((uint)in_stack_fffffffffffffba4 >> 0x18),
                                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
        }
        if (((local_16c == 0) &&
            (iVar5 = is_inter_block((MB_MODE_INFO *)
                                    CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)),
            pBVar2 = local_160, iVar5 != 0)) && (local_160[0x90] == BLOCK_4X4)) {
          local_176 = *local_160;
          local_17c = local_164 &
                      "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [local_176] - 1;
          local_180 = local_168 &
                      "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [local_176] - 1;
          iVar5 = av1_get_txb_size_index(local_176,local_17c,local_180);
          local_181 = pBVar2[(long)iVar5 + 0x92];
          local_175 = local_181;
        }
        local_14d = local_175;
      }
      else {
        local_14d = BLOCK_4X4;
      }
      local_239 = local_14d;
      *local_1d0 = local_14d;
      local_23a = 0;
      if (((local_1f1 & 1) == 0) || (local_1f0 != 0)) {
        local_248 = (loop_filter_info_n *)local_230[-local_208];
        if (local_224 == 0) {
          local_42c = local_1ec - (1 << ((byte)local_210 & 0x1f));
        }
        else {
          local_42c = local_1ec;
        }
        local_24c = local_42c;
        if (local_224 == 0) {
          local_430 = local_1e8;
        }
        else {
          local_430 = local_1e8 - (1 << ((byte)local_20c & 0x1f));
        }
        local_250 = local_430;
        BVar3 = local_1f2;
        if ((local_1f1 & 1) != 0) {
          local_190 = local_1e0;
          local_19c = local_42c;
          local_1a0 = local_430;
          local_1a4 = local_21c;
          local_1a8 = local_20c;
          local_1ac = local_210;
          local_198 = local_248;
          if ((local_1e0 == 0) ||
             (*(int *)(local_1e0 + 0x29c4 +
                      (ulong)((byte)*(undefined2 *)(local_248->lfthr[3].lim + 7) & 7) * 4) == 0)) {
            if (local_21c == 0) {
              local_1ad = local_248->lfthr[3].mblim[1];
            }
            else {
              local_1ad = av1_get_max_uv_txsize
                                    ((BLOCK_SIZE)((uint)in_stack_fffffffffffffba4 >> 0x18),
                                     in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
            }
            in_stack_fffffffffffffbcc = (uint)local_1ad;
            if (((local_1a4 == 0) &&
                (iVar5 = is_inter_block((MB_MODE_INFO *)
                                        CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0
                                                )), iVar5 != 0)) &&
               (local_198->lfthr[3].mblim[0] == '\0')) {
              local_1ae = local_198->lfthr[0].mblim[0];
              local_1b4 = local_19c &
                          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [local_1ae] - 1;
              local_1b8 = local_1a0 &
                          "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [local_1ae] - 1;
              in_stack_fffffffffffffbc0 = local_198;
              iVar5 = av1_get_txb_size_index(local_1ae,local_1b4,local_1b8);
              local_1b9 = in_stack_fffffffffffffbc0->lfthr[3].mblim[(long)iVar5 + 2];
              local_1ad = local_1b9;
            }
            local_182 = local_1ad;
            BVar3 = local_1ad;
          }
          else {
            local_182 = BLOCK_4X4;
            BVar3 = local_182;
          }
        }
        local_251 = BVar3;
        in_stack_fffffffffffffbbc = (uint)local_251;
        if ((local_1f1 & 1) != 0) {
          if (local_224 == 0) {
            in_stack_fffffffffffffbb8 = tx_size_wide[local_251];
          }
          else {
            in_stack_fffffffffffffbb8 = tx_size_high[local_251];
          }
          *local_218 = in_stack_fffffffffffffbb8;
        }
        local_252 = get_filter_level((AV1_COMMON *)
                                     CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                     in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                     in_stack_fffffffffffffbb8,
                                     (MB_MODE_INFO *)
                                     CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
        if (local_252 == 0) {
          local_252 = get_filter_level((AV1_COMMON *)
                                       CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
                                       ,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                       in_stack_fffffffffffffbb8,
                                       (MB_MODE_INFO *)
                                       CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)
                                      );
        }
        local_258 = (uint)(local_248 != local_238);
        if (local_258 == 0) {
          in_stack_fffffffffffffbb4 = in_stack_fffffffffffffbb4 & 0xffffff;
          if (local_238->lfthr[3].mblim[0] != '\0') {
            iVar5 = is_inter_block((MB_MODE_INFO *)
                                   CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
            in_stack_fffffffffffffbb4 = CONCAT13(iVar5 != 0,(int3)in_stack_fffffffffffffbb4);
          }
          local_23a = (byte)(in_stack_fffffffffffffbb4 >> 0x18);
        }
        if ((((local_23a & 1) == 0) || (local_258 != 0)) && (local_252 != 0)) {
          if (local_224 == 0) {
            in_stack_fffffffffffffbb0 = horz_filter_length_chroma[local_239][local_251];
          }
          else {
            in_stack_fffffffffffffbb0 = vert_filter_length_chroma[local_239][local_251];
          }
          *local_1c8 = (char)in_stack_fffffffffffffbb0;
          local_260 = local_1d8 + 0x4af0;
          *(long *)(local_1c8 + 8) = local_260 + (long)(int)(uint)local_252 * 0x30;
        }
      }
      if (local_224 == 0) {
        local_454 = tx_size_wide[local_239];
      }
      else {
        local_454 = tx_size_high[local_239];
      }
      local_264 = local_454;
      if (*local_218 < local_454) {
        local_458 = *local_218;
      }
      else {
        local_458 = local_454;
      }
      *local_218 = local_458;
      if (local_2cc == 0) {
        in_stack_fffffffffffffba4 = tx_size_high_unit[*local_2e0];
      }
      else {
        in_stack_fffffffffffffba4 = tx_size_wide_unit[*local_2e0];
      }
      local_2ed = *local_2e0;
      *local_2e8 = (in_stack_fffffffffffffba4 << ((byte)local_2ec & 0x1f)) + *local_2e8;
      local_2d8 = local_2d8 + (long)in_stack_fffffffffffffba4 * 0x10;
      local_2e0 = local_2e0 + in_stack_fffffffffffffba4;
      local_2f4 = in_stack_fffffffffffffba4;
    }
    local_370 = local_320;
    local_378 = in_stack_00000008;
    local_380 = 0;
    if ((((local_354 & 3) == 0) && ((int)(local_354 + 3) < local_344)) && (0xf < local_364)) {
      local_380 = 3;
    }
    else if ((((int)local_354 % 2 == 0) && ((int)(local_354 + 1) < local_344)) && (7 < local_364)) {
      local_380 = 1;
    }
    for (local_384 = 0; local_384 < local_348; local_384 = uVar1 + local_384) {
      if (*local_378 == BLOCK_INVALID) {
        *local_370 = 0;
        *local_378 = BLOCK_4X4;
      }
      if ((local_321 & 1) == 0) {
        filter_vert((uint8_t *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                    (int)((ulong)in_stack_fffffffffffffc10 >> 0x20),
                    (AV1_DEBLOCKING_PARAMETERS *)
                    CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                    (SequenceHeader *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                    (USE_FILTER_TYPE)((uint)iVar4 >> 0x18));
      }
      else {
        filter_vert_chroma(in_stack_fffffffffffffc28,
                           (uint8_t *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                           in_stack_fffffffffffffc1c,in_stack_fffffffffffffc10,
                           (SequenceHeader *)
                           CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                           (USE_FILTER_TYPE)(in_stack_fffffffffffffc04 >> 0x18));
      }
      uVar1 = tx_size_wide_unit[*local_378];
      local_370 = local_370 + (ulong)uVar1 * 0x10;
      local_378 = local_378 + uVar1;
    }
  }
  return;
}

Assistant:

void av1_filter_block_plane_vert_opt_chroma(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int plane, bool joint_filter_chroma,
    int num_mis_in_lpf_unit_height_log2) {
  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int mi_cols =
      ((plane_ptr->dst.width << scale_horz) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int mi_rows =
      ((plane_ptr->dst.height << scale_vert) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int plane_mi_rows = ROUND_POWER_OF_TWO(mi_rows, scale_vert);
  const int plane_mi_cols = ROUND_POWER_OF_TWO(mi_cols, scale_horz);
  const int y_range =
      AOMMIN((int)(plane_mi_rows - (mi_row >> scale_vert)),
             ((1 << num_mis_in_lpf_unit_height_log2) >> scale_vert));
  const int x_range = AOMMIN((int)(plane_mi_cols - (mi_col >> scale_horz)),
                             (MAX_MIB_SIZE >> scale_horz));
  const ptrdiff_t mode_step = (ptrdiff_t)1 << scale_horz;

  for (int y = 0; y < y_range; y++) {
    const uint32_t curr_y = mi_row + (y << scale_vert);
    const uint32_t x_start = mi_col + (0 << scale_horz);
    const uint32_t x_end = mi_col + (x_range << scale_horz);
    int min_height = tx_size_high[TX_64X64];
    set_lpf_parameters_for_line_chroma(params_buf, tx_buf, cm, xd, VERT_EDGE,
                                       x_start, curr_y, plane_ptr, x_end,
                                       mode_step, scale_horz, scale_vert,
                                       &min_height, plane, joint_filter_chroma);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    int use_filter_type = USE_SINGLE;
    int y_inc = 0;

    if ((y & 3) == 0 && (y + 3) < y_range && min_height >= 16) {
      // If we are on a row which is a multiple of 4, and the minimum height is
      // 16 pixels, then the current and below 3 rows must contain the same tx
      // block. This is because dim 16 can only happen every unit of 4 mi's.
      use_filter_type = USE_QUAD;
      y_inc = 3;
    } else if (y % 2 == 0 && (y + 1) < y_range && min_height >= 8) {
      // If we are on an even row, and the minimum height is 8 pixels, then the
      // current and below rows must contain the same tx block. This is because
      // dim 4 can only happen every unit of 2**0, and 8 every unit of 2**1,
      // etc.
      use_filter_type = USE_DUAL;
      y_inc = 1;
    }

    for (int x = 0; x < x_range;) {
      // inner loop always filter vertical edges in a MI block. If MI size
      // is 8x8, it will filter the vertical edge aligned with a 8x8 block.
      // If 4x4 transform is used, it will then filter the internal edge
      //  aligned with a 4x4 block
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      const int offset = y * MI_SIZE * dst_stride + x * MI_SIZE;
      if (joint_filter_chroma) {
        uint8_t *u_dst = plane_ptr[0].dst.buf + offset;
        uint8_t *v_dst = plane_ptr[1].dst.buf + offset;
        filter_vert_chroma(u_dst, v_dst, dst_stride, params, cm->seq_params,
                           use_filter_type);
      } else {
        uint8_t *dst_ptr = plane_ptr->dst.buf + offset;
        filter_vert(dst_ptr, dst_stride, params, cm->seq_params,
                    use_filter_type);
      }

      // advance the destination pointer
      const uint32_t advance_units = tx_size_wide_unit[*tx_size];
      x += advance_units;
      params += advance_units;
      tx_size += advance_units;
    }
    y += y_inc;
  }
}